

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O0

Formatter * demo::Tracing::GetContext_abi_cxx11_(void)

{
  Formatter *in_RDI;
  Formatter formatter;
  Formatter *this;
  Formatter *in_stack_fffffffffffffe98;
  Tracing *in_stack_fffffffffffffea0;
  
  this = in_RDI;
  Formatter::Formatter((Formatter *)0x1163b5);
  capture_thread::ThreadCapture<demo::Tracing>::GetCurrent();
  ReverseTrace(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Formatter::String_abi_cxx11_(this);
  Formatter::~Formatter((Formatter *)0x1163ec);
  return in_RDI;
}

Assistant:

std::string Tracing::GetContext() {
  Formatter formatter;
  ReverseTrace(GetCurrent(), &formatter);
  return formatter.String();
}